

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O3

bool __thiscall cmGhsMultiTargetGenerator::DetermineIfIntegrityApp(cmGhsMultiTargetGenerator *this)

{
  cmGeneratorTarget *pcVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  string *psVar7;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range1;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string local_48;
  
  pcVar1 = this->GeneratorTarget;
  paVar9 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"ghs_integrity_app","");
  pcVar6 = cmGeneratorTarget::GetProperty(pcVar1,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar9) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (pcVar6 == (char *)0x0) {
    local_48._M_dataplus._M_p = (pointer)0x0;
    local_48._M_string_length = 0;
    local_48.field_2._M_allocated_capacity = 0;
    cmGeneratorTarget::GetSourceFiles
              (this->GeneratorTarget,
               (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_48,
               &this->ConfigName);
    sVar3 = local_48._M_string_length;
    _Var2._M_p = local_48._M_dataplus._M_p;
    if (local_48._M_dataplus._M_p == (pointer)local_48._M_string_length) {
      bVar4 = false;
    }
    else {
      do {
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)_Var2._M_p + 8);
        psVar7 = cmSourceFile::GetExtension_abi_cxx11_(*(cmSourceFile **)_Var2._M_p);
        iVar5 = std::__cxx11::string::compare((char *)psVar7);
        bVar4 = iVar5 == 0;
        if (bVar4) break;
        _Var2._M_p = (pointer)paVar9;
      } while (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)sVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return bVar4;
    }
    uVar8 = local_48.field_2._M_allocated_capacity - (long)local_48._M_dataplus._M_p;
  }
  else {
    pcVar1 = this->GeneratorTarget;
    local_48._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"ghs_integrity_app","");
    pcVar6 = cmGeneratorTarget::GetProperty(pcVar1,&local_48);
    bVar4 = cmSystemTools::IsOn(pcVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == paVar9) {
      return bVar4;
    }
    uVar8 = local_48.field_2._M_allocated_capacity + 1;
  }
  operator_delete(local_48._M_dataplus._M_p,uVar8);
  return bVar4;
}

Assistant:

bool cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()
{
  const char* p = this->GeneratorTarget->GetProperty("ghs_integrity_app");
  if (p) {
    return cmSystemTools::IsOn(
      this->GeneratorTarget->GetProperty("ghs_integrity_app"));
  }
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);
  for (auto& sf : sources) {
    if ("int" == sf->GetExtension()) {
      return true;
    }
  }
  return false;
}